

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerOpenSavepoint(Pager *pPager,int nSavepoint)

{
  PagerSavepoint *pPVar1;
  Bitvec *pBVar2;
  PagerSavepoint *aNew;
  int ii;
  int nCurrent;
  int rc;
  int nSavepoint_local;
  Pager *pPager_local;
  
  aNew._0_4_ = pPager->nSavepoint;
  pPVar1 = (PagerSavepoint *)sqlite3Realloc(pPager->aSavepoint,(long)nSavepoint * 0x30);
  if (pPVar1 == (PagerSavepoint *)0x0) {
    pPager_local._4_4_ = 7;
  }
  else {
    memset(pPVar1 + (int)aNew,0,(long)(nSavepoint - (int)aNew) * 0x30);
    pPager->aSavepoint = pPVar1;
    for (; (int)aNew < nSavepoint; aNew._0_4_ = (int)aNew + 1) {
      pPVar1[(int)aNew].nOrig = pPager->dbSize;
      if ((pPager->jfd->pMethods == (sqlite3_io_methods *)0x0) || (pPager->journalOff < 1)) {
        pPVar1[(int)aNew].iOffset = (ulong)pPager->sectorSize;
      }
      else {
        pPVar1[(int)aNew].iOffset = pPager->journalOff;
      }
      pPVar1[(int)aNew].iSubRec = pPager->nSubRec;
      pBVar2 = sqlite3BitvecCreate(pPager->dbSize);
      pPVar1[(int)aNew].pInSavepoint = pBVar2;
      if (pPVar1[(int)aNew].pInSavepoint == (Bitvec *)0x0) {
        return 7;
      }
      if (pPager->pWal != (Wal *)0x0) {
        sqlite3WalSavepoint(pPager->pWal,pPVar1[(int)aNew].aWalData);
      }
      pPager->nSavepoint = (int)aNew + 1;
    }
    pPager_local._4_4_ = 0;
  }
  return pPager_local._4_4_;
}

Assistant:

static SQLITE_NOINLINE int pagerOpenSavepoint(Pager *pPager, int nSavepoint){
  int rc = SQLITE_OK;                       /* Return code */
  int nCurrent = pPager->nSavepoint;        /* Current number of savepoints */
  int ii;                                   /* Iterator variable */
  PagerSavepoint *aNew;                     /* New Pager.aSavepoint array */

  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );
  assert( nSavepoint>nCurrent && pPager->useJournal );

  /* Grow the Pager.aSavepoint array using realloc(). Return SQLITE_NOMEM
  ** if the allocation fails. Otherwise, zero the new portion in case a 
  ** malloc failure occurs while populating it in the for(...) loop below.
  */
  aNew = (PagerSavepoint *)sqlite3Realloc(
      pPager->aSavepoint, sizeof(PagerSavepoint)*nSavepoint
  );
  if( !aNew ){
    return SQLITE_NOMEM_BKPT;
  }
  memset(&aNew[nCurrent], 0, (nSavepoint-nCurrent) * sizeof(PagerSavepoint));
  pPager->aSavepoint = aNew;

  /* Populate the PagerSavepoint structures just allocated. */
  for(ii=nCurrent; ii<nSavepoint; ii++){
    aNew[ii].nOrig = pPager->dbSize;
    if( isOpen(pPager->jfd) && pPager->journalOff>0 ){
      aNew[ii].iOffset = pPager->journalOff;
    }else{
      aNew[ii].iOffset = JOURNAL_HDR_SZ(pPager);
    }
    aNew[ii].iSubRec = pPager->nSubRec;
    aNew[ii].pInSavepoint = sqlite3BitvecCreate(pPager->dbSize);
    if( !aNew[ii].pInSavepoint ){
      return SQLITE_NOMEM_BKPT;
    }
    if( pagerUseWal(pPager) ){
      sqlite3WalSavepoint(pPager->pWal, aNew[ii].aWalData);
    }
    pPager->nSavepoint = ii+1;
  }
  assert( pPager->nSavepoint==nSavepoint );
  assertTruncateConstraint(pPager);
  return rc;
}